

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

void __thiscall BackendBase::setDefaultChannelOrder(BackendBase *this)

{
  ALCdevice *pAVar1;
  value_type local_c;
  
  local_c = 0xffffffff;
  std::array<unsigned_int,_16UL>::fill(&(this->mDevice->RealOut).ChannelIndex,&local_c);
  pAVar1 = this->mDevice;
  switch(pAVar1->FmtChans) {
  case DevFmtMono:
  case DevFmtChannelsDefault:
  case DevFmtQuad:
  case DevFmtX51:
  case DevFmtX61:
  case DevFmtAmbi3D:
    setDefaultWFXChannelOrder(this);
    break;
  case DevFmtX71:
    (pAVar1->RealOut).ChannelIndex._M_elems[4] = 2;
    (pAVar1->RealOut).ChannelIndex._M_elems[5] = 3;
    (pAVar1->RealOut).ChannelIndex._M_elems[0] = 0;
    (pAVar1->RealOut).ChannelIndex._M_elems[1] = 1;
    (pAVar1->RealOut).ChannelIndex._M_elems[2] = 4;
    (pAVar1->RealOut).ChannelIndex._M_elems[3] = 5;
    (pAVar1->RealOut).ChannelIndex._M_elems[7] = 6;
    (pAVar1->RealOut).ChannelIndex._M_elems[8] = 7;
    break;
  case DevFmtX51Rear:
    (pAVar1->RealOut).ChannelIndex._M_elems[4] = 2;
    (pAVar1->RealOut).ChannelIndex._M_elems[5] = 3;
    (pAVar1->RealOut).ChannelIndex._M_elems[0] = 0;
    (pAVar1->RealOut).ChannelIndex._M_elems[1] = 1;
    (pAVar1->RealOut).ChannelIndex._M_elems[2] = 4;
    (pAVar1->RealOut).ChannelIndex._M_elems[3] = 5;
  }
  return;
}

Assistant:

void BackendBase::setDefaultChannelOrder()
{
    mDevice->RealOut.ChannelIndex.fill(INVALID_CHANNEL_INDEX);

    switch(mDevice->FmtChans)
    {
    case DevFmtX51Rear:
        mDevice->RealOut.ChannelIndex[FrontLeft]   = 0;
        mDevice->RealOut.ChannelIndex[FrontRight]  = 1;
        mDevice->RealOut.ChannelIndex[BackLeft]    = 2;
        mDevice->RealOut.ChannelIndex[BackRight]   = 3;
        mDevice->RealOut.ChannelIndex[FrontCenter] = 4;
        mDevice->RealOut.ChannelIndex[LFE]         = 5;
        return;
    case DevFmtX71:
        mDevice->RealOut.ChannelIndex[FrontLeft]   = 0;
        mDevice->RealOut.ChannelIndex[FrontRight]  = 1;
        mDevice->RealOut.ChannelIndex[BackLeft]    = 2;
        mDevice->RealOut.ChannelIndex[BackRight]   = 3;
        mDevice->RealOut.ChannelIndex[FrontCenter] = 4;
        mDevice->RealOut.ChannelIndex[LFE]         = 5;
        mDevice->RealOut.ChannelIndex[SideLeft]    = 6;
        mDevice->RealOut.ChannelIndex[SideRight]   = 7;
        return;

    /* Same as WFX order */
    case DevFmtMono:
    case DevFmtStereo:
    case DevFmtQuad:
    case DevFmtX51:
    case DevFmtX61:
    case DevFmtAmbi3D:
        setDefaultWFXChannelOrder();
        break;
    }
}